

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<cs_impl::any_(*)(const_cs_impl::member_visitor_&),_cs_impl::any_(*)(const_cs_impl::member_visitor_&)>
::call(cni_helper<cs_impl::any_(*)(const_cs_impl::member_visitor_&),_cs_impl::any_(*)(const_cs_impl::member_visitor_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  sequence<0> *in_RDX;
  _Any_data local_c0 [2];
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (*(long *)(in_RDX + 8) - *(long *)in_RDX == 8) {
    _call<0>((cni_helper<cs_impl::any_(*)(const_cs_impl::member_visitor_&),_cs_impl::any_(*)(const_cs_impl::member_visitor_&)>
              *)local_c0,args,in_RDX);
    if ((_func_void *)local_c0[0]._0_8_ != (_func_void *)0x0) {
      *(long *)(local_c0[0]._M_unused._M_function_pointer + 8) =
           *(long *)(local_c0[0]._M_unused._M_function_pointer + 8) + 1;
    }
    *(undefined8 *)&(this->mFunc).super__Function_base._M_functor = local_c0[0]._M_unused._M_object;
    any::recycle((any *)local_c0);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_80,1);
  std::operator+(&local_60,"Wrong size of the arguments. Expected ",&local_80);
  std::operator+(&local_40,&local_60,", provided ");
  std::__cxx11::to_string(&local_a0,*(long *)(in_RDX + 8) - *(long *)in_RDX >> 3);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &local_40,&local_a0);
  cs::runtime_error::runtime_error(this_00,(string *)local_c0);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}